

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine_test.c
# Opt level: O2

int test_encode_char(void)

{
  char *__s2;
  int iVar1;
  long lVar2;
  char encoded_char [10];
  
  lVar2 = 8;
  do {
    if (lVar2 + 0x10 == 0x98) {
      statemachine_encode_char(-1,encoded_char,1);
      if (encoded_char[0] == '\0') {
        statemachine_encode_char(-1,encoded_char,2);
        if (encoded_char._0_2_ == 0x5c) {
          statemachine_encode_char(-1,encoded_char,3);
          iVar1 = bcmp(encoded_char,"\\x",3);
          if (iVar1 == 0) {
            statemachine_encode_char(-1,encoded_char,4);
            if (encoded_char._0_4_ == 0x66785c) {
              statemachine_encode_char(-1,encoded_char,5);
              iVar1 = bcmp(encoded_char,"\\xff",5);
              if (iVar1 == 0) {
                return 0;
              }
              printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                     ,0x15e,encoded_char,"\\xff");
              iVar1 = bcmp(encoded_char,"\\xff",5);
              if (iVar1 != 0) {
                __assert_fail("!strcmp((encoded_char), (\"\\\\xff\"))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                              ,0x15e,"int test_encode_char()");
              }
            }
            else {
              printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                     ,0x15b,encoded_char,"\\xf");
              if (encoded_char._0_4_ != 0x66785c) {
                __assert_fail("!strcmp((encoded_char), (\"\\\\xf\"))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                              ,0x15b,"int test_encode_char()");
              }
            }
          }
          else {
            printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                   ,0x158,encoded_char,"\\x");
            iVar1 = bcmp(encoded_char,"\\x",3);
            if (iVar1 != 0) {
              __assert_fail("!strcmp((encoded_char), (\"\\\\x\"))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                            ,0x158,"int test_encode_char()");
            }
          }
        }
        else {
          printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                 ,0x155,encoded_char,"\\");
          if (encoded_char._0_2_ != 0x5c) {
            __assert_fail("!strcmp((encoded_char), (\"\\\\\"))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                          ,0x155,"int test_encode_char()");
          }
        }
      }
      else {
        printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
               ,0x152,encoded_char,"");
        if (encoded_char[0] != '\0') {
          __assert_fail("!strcmp((encoded_char), (\"\"))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                        ,0x152,"int test_encode_char()");
        }
      }
      goto LAB_001035de;
    }
    __s2 = *(char **)(&DAT_00108d60 + lVar2);
    statemachine_encode_char
              (*(char *)((long)&__do_global_dtors_aux_fini_array_entry + lVar2),encoded_char,10);
    iVar1 = strcmp(encoded_char,__s2);
    lVar2 = lVar2 + 0x10;
  } while (iVar1 == 0);
  printf("%s: %d: ASSERT FAILED: \'%s\' != \'%s\'\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
         ,0x14e,encoded_char,__s2);
  iVar1 = strcmp(encoded_char,__s2);
  if (iVar1 != 0) {
    __assert_fail("!strcmp((encoded_char), (encode_map[i].result))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/statemachine_test.c"
                  ,0x14e,"int test_encode_char()");
  }
LAB_001035de:
  exit(1);
}

Assistant:

int test_encode_char()
{
  char encoded_char[10];
  int i;

  struct {
    char chr;
    const char *result;
  } encode_map[] = {
    { 'x', "x" },
    { '0', "0" },
    { '\n', "\\n" },
    { '\r', "\\r" },
    { '\t', "\\t" },
    { '\\', "\\\\" },
    { '\0', "\\x00" },
    { '\xF0', "\\xf0" },
    { '\0', NULL}  // Terminates when output == NULL
  };

  for (i = 0; encode_map[i].result; i++) {
    statemachine_encode_char(encode_map[i].chr, encoded_char,
                             sizeof(encoded_char) / sizeof(*encoded_char));
    ASSERT_STREQ(encoded_char, encode_map[i].result);
  }

  statemachine_encode_char('\xFF', encoded_char, 1);
  ASSERT_STREQ(encoded_char, "");

  statemachine_encode_char('\xFF', encoded_char, 2);
  ASSERT_STREQ(encoded_char, "\\");

  statemachine_encode_char('\xFF', encoded_char, 3);
  ASSERT_STREQ(encoded_char, "\\x");

  statemachine_encode_char('\xFF', encoded_char, 4);
  ASSERT_STREQ(encoded_char, "\\xf");

  statemachine_encode_char('\xFF', encoded_char, 5);
  ASSERT_STREQ(encoded_char, "\\xff");

  return 0;
}